

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeSavepoint(sqlite3_vtab *pVtab,int iSavepoint)

{
  long in_RDI;
  u8 iwt;
  Rtree *pRtree;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = *(undefined1 *)(in_RDI + 0x28);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  nodeBlobReset((Rtree *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  *(undefined1 *)(in_RDI + 0x28) = uVar1;
  return 0;
}

Assistant:

static int rtreeSavepoint(sqlite3_vtab *pVtab, int iSavepoint){
  Rtree *pRtree = (Rtree *)pVtab;
  u8 iwt = pRtree->inWrTrans;
  UNUSED_PARAMETER(iSavepoint);
  pRtree->inWrTrans = 0;
  nodeBlobReset(pRtree);
  pRtree->inWrTrans = iwt;
  return SQLITE_OK;
}